

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

void __thiscall
duckdb::ART::Erase(ART *this,Node *node,reference<const_ARTKey> key,idx_t depth,
                  reference<const_ARTKey> row_id,GateStatus status)

{
  byte bVar1;
  bool bVar2;
  optional_idx oVar3;
  unsafe_optional_ptr<Node> node_00;
  uint8_t byte;
  IndexPointer child;
  ulong uVar4;
  ulong uVar5;
  GateStatus status_00;
  idx_t iVar6;
  undefined7 in_register_00000089;
  reference<Node> next;
  reference<Node> ref;
  idx_t temp_depth;
  idx_t local_60;
  reference<duckdb::Node> local_58;
  undefined4 local_4c;
  reference<const_ARTKey> local_48;
  reference<duckdb::Node> local_40;
  idx_t local_38;
  
  uVar5 = (node->super_IndexPointer).data;
  if (uVar5 >> 0x38 == 0) {
    return;
  }
  local_4c = (undefined4)CONCAT71(in_register_00000089,status);
  local_60 = depth;
  local_58._M_data = node;
  if ((uVar5 & 0x7f00000000000000) == 0x100000000000000) {
    oVar3 = TraverseInternal<duckdb::Node>(this,&local_58,key._M_data,&local_60,true);
    if (oVar3.index != 0xffffffffffffffff) {
      return;
    }
    uVar5 = ((local_58._M_data)->super_IndexPointer).data;
  }
  bVar1 = (byte)(uVar5 >> 0x38);
  if ((bVar1 & 0x7f) == 2) {
    Leaf::TransformToNested(this,local_58._M_data);
    uVar5 = ((local_58._M_data)->super_IndexPointer).data;
  }
  else if ((bVar1 & 0x7f) == 7) {
    uVar4 = *(ulong *)(row_id._M_data)->data ^ 0x80;
    if ((uVar5 & 0xffffffffffffff) !=
        (*(ulong *)(row_id._M_data)->data >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
         (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8
         | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38)) {
      return;
    }
    Node::Free(this,node);
    return;
  }
  status_00 = (GateStatus)local_4c;
  if ((status_00 == GATE_NOT_SET) && ((long)uVar5 < 0)) {
    Erase(this,local_58._M_data,row_id,0,row_id,GATE_SET);
    return;
  }
  if ((byte)(((byte)(uVar5 >> 0x38) & 0x7f) - 8) < 3) {
    local_38 = CONCAT71(local_38._1_7_,(key._M_data)->data[local_60]);
    bVar2 = Node::HasByte(local_58._M_data,this,(uint8_t *)&local_38);
    if (!bVar2) {
      return;
    }
    byte = (key._M_data)->data[local_60];
  }
  else {
    node_00 = GetChildInternal<duckdb::Node_const>
                        (this,local_58._M_data,(key._M_data)->data[local_60]);
    if (node_00.ptr == (Node *)0x0) {
      return;
    }
    iVar6 = ((node_00.ptr)->super_IndexPointer).data;
    local_48._M_data = key._M_data;
    if ((iVar6 & 0x7f00000000000000) == 0x200000000000000) {
      Leaf::TransformToNested(this,node_00.ptr);
      iVar6 = ((node_00.ptr)->super_IndexPointer).data;
    }
    status_00 = (GateStatus)local_4c;
    if ((status_00 == GATE_NOT_SET) && ((long)iVar6 < 0)) {
      Erase(this,node_00.ptr,row_id,0,row_id,GATE_SET);
      child.data = ((node_00.ptr)->super_IndexPointer).data;
      byte = (local_48._M_data)->data[local_60];
      if (0xffffffffffffff < child.data) {
LAB_00c13101:
        Node::ReplaceChild(local_58._M_data,this,byte,(Node)child.data);
        return;
      }
      status_00 = GATE_NOT_SET;
      key._M_data = local_48._M_data;
    }
    else {
      local_38 = local_60 + 1;
      local_40._M_data = (Node *)node_00;
      if ((iVar6 & 0x7f00000000000000) == 0x100000000000000) {
        oVar3 = TraverseInternal<duckdb::Node>(this,&local_40,local_48._M_data,&local_38,true);
        if (oVar3.index != 0xffffffffffffffff) {
          return;
        }
        iVar6 = ((local_40._M_data)->super_IndexPointer).data;
      }
      if ((iVar6 & 0x7f00000000000000) == 0x700000000000000) {
        uVar5 = *(ulong *)(row_id._M_data)->data ^ 0x80;
        if ((iVar6 & 0xffffffffffffff) !=
            (*(ulong *)(row_id._M_data)->data >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
             (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
             (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
            uVar5 << 0x38)) {
          return;
        }
        byte = (local_48._M_data)->data[local_60];
        key._M_data = local_48._M_data;
      }
      else {
        Erase(this,node_00.ptr,local_48,local_60 + 1,row_id,status_00);
        child.data = ((node_00.ptr)->super_IndexPointer).data;
        byte = (local_48._M_data)->data[local_60];
        key._M_data = local_48._M_data;
        if (0xffffffffffffff < child.data) goto LAB_00c13101;
      }
    }
  }
  Node::DeleteChild(this,local_58._M_data,node,byte,status_00,key._M_data);
  return;
}

Assistant:

void ART::Erase(Node &node, reference<const ARTKey> key, idx_t depth, reference<const ARTKey> row_id,
                GateStatus status) {
	if (!node.HasMetadata()) {
		return;
	}

	// Traverse the prefix.
	reference<Node> next(node);
	if (next.get().GetType() == NType::PREFIX) {
		auto pos = Prefix::TraverseMutable(*this, next, key, depth);
		if (pos.IsValid()) {
			// Prefixes don't match: nothing to erase.
			return;
		}
	}

	//	Delete the row ID from the leaf.
	//	This is the root node, which can be a leaf with possible prefix nodes.
	if (next.get().GetType() == NType::LEAF_INLINED) {
		if (next.get().GetRowId() == row_id.get().GetRowId()) {
			Node::Free(*this, node);
		}
		return;
	}

	// Transform a deprecated leaf.
	if (next.get().GetType() == NType::LEAF) {
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		Leaf::TransformToNested(*this, next);
	}

	// Enter a nested leaf.
	if (status == GateStatus::GATE_NOT_SET && next.get().GetGateStatus() == GateStatus::GATE_SET) {
		return Erase(next, row_id, 0, row_id, GateStatus::GATE_SET);
	}

	D_ASSERT(depth < key.get().len);
	if (next.get().IsLeafNode()) {
		auto byte = key.get()[depth];
		if (next.get().HasByte(*this, byte)) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		}
		return;
	}

	auto child = next.get().GetChildMutable(*this, key.get()[depth]);
	if (!child) {
		// No child at the byte: nothing to erase.
		return;
	}

	// Transform a deprecated leaf.
	if (child->GetType() == NType::LEAF) {
		D_ASSERT(status == GateStatus::GATE_NOT_SET);
		Leaf::TransformToNested(*this, *child);
	}

	// Enter a nested leaf.
	if (status == GateStatus::GATE_NOT_SET && child->GetGateStatus() == GateStatus::GATE_SET) {
		Erase(*child, row_id, 0, row_id, GateStatus::GATE_SET);
		if (!child->HasMetadata()) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		} else {
			next.get().ReplaceChild(*this, key.get()[depth], *child);
		}
		return;
	}

	auto temp_depth = depth + 1;
	reference<Node> ref(*child);

	if (ref.get().GetType() == NType::PREFIX) {
		auto pos = Prefix::TraverseMutable(*this, ref, key, temp_depth);
		if (pos.IsValid()) {
			// Prefixes don't match: nothing to erase.
			return;
		}
	}

	if (ref.get().GetType() == NType::LEAF_INLINED) {
		if (ref.get().GetRowId() == row_id.get().GetRowId()) {
			Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
		}
		return;
	}

	// Recurse.
	Erase(*child, key, depth + 1, row_id, status);
	if (!child->HasMetadata()) {
		Node::DeleteChild(*this, next, node, key.get()[depth], status, key.get());
	} else {
		next.get().ReplaceChild(*this, key.get()[depth], *child);
	}
}